

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O0

void vbytefse::decode(uint8_t *in_ptr,size_t in_size_u8,uint32_t *out_ptr,size_t out_size_u32,
                     uint8_t *buf)

{
  uint8_t *in_RCX;
  size_t in_RDX;
  uint32_t *in_RSI;
  int *in_RDI;
  size_t vbyte_bytes;
  uint32_t *in_ptr_u32;
  size_t in_stack_00003fc8;
  void *in_stack_00003fd0;
  size_t in_stack_00003fd8;
  void *in_stack_00003fe0;
  int *in_size_u8_00;
  
  in_size_u8_00 = in_RDI + 1;
  if (*in_RDI == 0) {
    vbyte::decode((uint8_t *)vbyte_bytes,(size_t)in_size_u8_00,in_RSI,in_RDX,in_RCX);
  }
  else {
    FSE_decompress(in_stack_00003fe0,in_stack_00003fd8,in_stack_00003fd0,in_stack_00003fc8);
    vbyte::decode((uint8_t *)vbyte_bytes,(size_t)in_size_u8_00,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

static void decode(const uint8_t* in_ptr, size_t in_size_u8,
        uint32_t* out_ptr, size_t out_size_u32, uint8_t* buf = NULL)
    {
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
        size_t vbyte_bytes = *in_ptr_u32;
        in_ptr += +sizeof(uint32_t);
        if (vbyte_bytes == 0) {
            vbyte::decode(
                in_ptr, in_size_u8 - sizeof(uint32_t), out_ptr, out_size_u32);
        } else {
            FSE_decompress(
                buf, vbyte_bytes, in_ptr, in_size_u8 - sizeof(uint32_t));
            vbyte::decode(buf, vbyte_bytes, out_ptr, out_size_u32);
        }
    }